

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  ssize_t sVar1;
  time_t in_stack_000000b8;
  time_t in_stack_000000c0;
  socket_t in_stack_000000cc;
  socket_t in_stack_fffffffffffffff0;
  undefined1 local_9;
  
  sVar1 = select_write(in_stack_000000cc,in_stack_000000c0,in_stack_000000b8);
  local_9 = false;
  if (0 < sVar1) {
    local_9 = is_socket_alive(in_stack_fffffffffffffff0);
  }
  return local_9;
}

Assistant:

inline bool SocketStream::is_writable() const {
  return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0 &&
         is_socket_alive(sock_);
}